

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenTypeGet_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,Type *type)

{
  bool bVar1;
  BaseType *type_00;
  Type *type_local;
  KotlinGenerator *this_local;
  
  bVar1 = IsScalar(type->base_type);
  if (bVar1) {
    GenTypeBasic_abi_cxx11_(__return_storage_ptr__,(KotlinGenerator *)type,type_00);
  }
  else {
    GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,type);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet(const Type &type) const {
    return IsScalar(type.base_type) ? GenTypeBasic(type.base_type)
                                    : GenTypePointer(type);
  }